

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetVisibleRotation
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *pAVar2;
  uint uVar3;
  char *pcVar4;
  int val;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003f1640;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f1630:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f1640:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1a76,
                  "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar2 == (AActor *)0x0) goto LAB_003f141a;
    bVar1 = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f1640;
    }
  }
  else {
    if (pAVar2 != (AActor *)0x0) goto LAB_003f1630;
LAB_003f141a:
    pAVar2 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f16ed:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a77,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_58 = param[1].field_0.field_1.a;
LAB_003f1481:
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f170c:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a78,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = param[2].field_0.field_1.a;
LAB_003f1498:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f16bc:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a79,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_48 = param[3].field_0.field_1.a;
LAB_003f14af:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f169d:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a7a,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_50 = param[4].field_0.field_1.a;
LAB_003f14c6:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f167e:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a7b,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar3 = param[5].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f16ed;
    }
    local_58 = param[1].field_0.field_1.a;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003f1481;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f170c;
    }
    local_40 = param[2].field_0.field_1.a;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003f1498;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f16bc;
    }
    local_48 = param[3].field_0.field_1.a;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003f14af;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f169d;
    }
    local_50 = param[4].field_0.field_1.a;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003f14c6;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f167e;
    }
    uVar3 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003f165f;
      }
      goto LAB_003f14e7;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f165f:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1a7c,
                  "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003f14e7:
  pAVar2 = COPY_AAPTR(pAVar2,param[6].field_0.i);
  val = 1;
  if (pAVar2 == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    val = 0;
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a82,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if ((uVar3 & 1) == 0) {
      (pAVar2->VisibleStartAngle).Degrees = (double)local_58;
    }
    if ((uVar3 & 2) == 0) {
      (pAVar2->VisibleEndAngle).Degrees = (double)local_40;
    }
    if ((uVar3 & 4) == 0) {
      (pAVar2->VisibleStartPitch).Degrees = (double)local_48;
    }
    if ((uVar3 & 8) == 0) {
      (pAVar2->VisibleEndPitch).Degrees = (double)local_50;
    }
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1a96,
                    "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  VMReturn::SetInt(ret,val);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetVisibleRotation)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF(anglestart)
	PARAM_ANGLE_DEF(angleend)	
	PARAM_ANGLE_DEF(pitchstart)
	PARAM_ANGLE_DEF(pitchend)	
	PARAM_INT_DEF(flags)		
	PARAM_INT_DEF(ptr)			

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (mobj == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}
		
	if (!(flags & VRF_NOANGLESTART))
	{
		mobj->VisibleStartAngle = anglestart;
	}
	if (!(flags & VRF_NOANGLEEND))
	{
		mobj->VisibleEndAngle = angleend;
	}
	if (!(flags & VRF_NOPITCHSTART))
	{
		mobj->VisibleStartPitch = pitchstart;
	}
	if (!(flags & VRF_NOPITCHEND))
	{
		mobj->VisibleEndPitch = pitchend;
	}

	ACTION_RETURN_BOOL(true);
}